

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O0

int gdAffineEqual(double *m1,double *m2)

{
  bool local_19;
  double *m2_local;
  double *m1_local;
  
  local_19 = false;
  if ((((ABS(*m1 - *m2) < 1e-06) && (local_19 = false, ABS(m1[1] - m2[1]) < 1e-06)) &&
      (local_19 = false, ABS(m1[2] - m2[2]) < 1e-06)) &&
     ((local_19 = false, ABS(m1[3] - m2[3]) < 1e-06 &&
      (local_19 = false, ABS(m1[4] - m2[4]) < 1e-06)))) {
    local_19 = ABS(m1[5] - m2[5]) < 1e-06;
  }
  return (int)local_19;
}

Assistant:

BGD_DECLARE(int) gdAffineEqual (const double m1[6], const double m2[6])
{
  return (fabs (m1[0] - m2[0]) < GD_EPSILON &&
	  fabs (m1[1] - m2[1]) < GD_EPSILON &&
	  fabs (m1[2] - m2[2]) < GD_EPSILON &&
	  fabs (m1[3] - m2[3]) < GD_EPSILON &&
	  fabs (m1[4] - m2[4]) < GD_EPSILON &&
	  fabs (m1[5] - m2[5]) < GD_EPSILON);
}